

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<unsigned_int,_ValueRelativeOffset,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
         *this)

{
  uint uVar1;
  uint newSize;
  int iVar2;
  ValueNumber VVar3;
  uint uVar4;
  EntryType *dst;
  int *piVar5;
  long lVar6;
  long lVar7;
  uint bucketCount;
  int *local_40;
  int *newBuckets;
  
  uVar1 = this->count;
  newSize = uVar1 * 2;
  bucketCount = 4;
  if ((8 < newSize) && (bucketCount = uVar1 & 0x7fffffff, (uVar1 - 1 & bucketCount) != 0)) {
    iVar2 = 0x1f;
    if (bucketCount != 0) {
      for (; bucketCount >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar2 ^ 0x1f) & 0x1f);
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<unsigned_int,ValueRelativeOffset>,ValueRelativeOffset,Memory::JitArenaAllocator>
              (dst,(long)(int)newSize,this->entries,(long)this->count);
    DeleteEntries(this,this->entries,this->size);
    this->entries = dst;
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::SimpleHashedEntry<unsigned_int,ValueRelativeOffset>,ValueRelativeOffset,Memory::JitArenaAllocator>
              ((SimpleHashedEntry<unsigned_int,_ValueRelativeOffset> *)newBuckets,(long)(int)newSize
               ,this->entries,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar2 = this->count;
    if (0 < iVar2) {
      lVar6 = 0;
      lVar7 = 0;
      piVar5 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar5 + lVar6 + 0x10)) {
          VVar3 = ValueRelativeOffset::BaseValueNumber
                            ((ValueRelativeOffset *)((long)piVar5 + lVar6));
          uVar4 = GetBucket(VVar3 * 2 + 1,bucketCount,this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar6 + 0x10) = local_40[(int)uVar4];
          local_40[(int)uVar4] = (int)lVar7;
          iVar2 = this->count;
          piVar5 = newBuckets;
        }
        lVar7 = lVar7 + 1;
        lVar6 = lVar6 + 0x18;
      } while (lVar7 < iVar2);
    }
    DeleteBuckets(this,this->buckets,this->bucketCount);
    DeleteEntries(this,this->entries,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    this->buckets = local_40;
    this->entries = (Type)newBuckets;
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }